

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaF_close(lua_State *L,StkId level)

{
  byte bVar1;
  int iVar2;
  global_State *pgVar3;
  GCObject *o;
  TValue *pTVar4;
  global_State *pgVar5;
  GCObject *v;
  
  pgVar3 = L->l_G;
  while ((o = L->openupval, o != (GCObject *)0x0 && (level <= (o->h).metatable))) {
    L->openupval = (o->gch).next;
    if ((~pgVar3->currentwhite & (o->gch).marked & 3) == 0) {
      pTVar4 = (o->h).array;
      ((o->th).l_G)->ud = pTVar4;
      pTVar4[2].value = (Value)(o->h).node;
      (o->h).array = (TValue *)((o->p).k)->value;
      iVar2 = ((o->p).k)->tt;
      *(int *)&(o->h).node = iVar2;
      (o->h).metatable = (Table *)&(o->h).array;
      pgVar5 = L->l_G;
      (o->gch).next = pgVar5->rootgc;
      pgVar5->rootgc = o;
      bVar1 = (o->gch).marked;
      if ((bVar1 & 7) == 0) {
        if (pgVar5->gcstate == '\x01') {
          (o->gch).marked = bVar1 | 4;
          if ((3 < iVar2) && (v = (GCObject *)(o->h).array, ((v->gch).marked & 3) != 0)) {
            luaC_barrierf(L,o,v);
          }
        }
        else {
          (o->gch).marked = pgVar5->currentwhite & 3 | bVar1;
        }
      }
    }
    else {
      luaF_freeupval(L,&o->uv);
    }
  }
  return;
}

Assistant:

static void luaF_close(lua_State*L,StkId level){
UpVal*uv;
global_State*g=G(L);
while(L->openupval!=NULL&&(uv=ngcotouv(L->openupval))->v>=level){
GCObject*o=obj2gco(uv);
L->openupval=uv->next;
if(isdead(g,o))
luaF_freeupval(L,uv);
else{
unlinkupval(uv);
setobj(L,&uv->u.value,uv->v);
uv->v=&uv->u.value;
luaC_linkupval(L,uv);
}
}
}